

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O1

void __thiscall
CRenderTools::MapScreenToGroup
          (CRenderTools *this,float CenterX,float CenterY,CMapItemGroup *pGroup,float Zoom)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined4 in_XMM6_Db;
  float fVar10;
  
  iVar3 = (pGroup->super_CMapItemGroup_v1).m_ParallaxX;
  iVar4 = (pGroup->super_CMapItemGroup_v1).m_ParallaxY;
  iVar5 = (pGroup->super_CMapItemGroup_v1).m_OffsetX;
  iVar6 = (pGroup->super_CMapItemGroup_v1).m_OffsetY;
  uVar1 = this->m_pGraphics->m_ScreenWidth;
  uVar2 = this->m_pGraphics->m_ScreenHeight;
  fVar10 = (float)(int)uVar1 / (float)(int)uVar2;
  if (fVar10 < 0.0) {
    fVar7 = sqrtf(fVar10);
    in_XMM6_Db = 0;
  }
  else {
    fVar7 = SQRT(fVar10);
  }
  fVar8 = (1072.3805 / fVar7) * fVar10;
  fVar9 = 1500.0;
  if (fVar8 <= 1500.0) {
    fVar9 = fVar8;
  }
  fVar8 = (float)(~-(uint)(1500.0 < fVar8) & (uint)(1072.3805 / fVar7) |
                 (uint)(1500.0 / fVar10) & -(uint)(1500.0 < fVar8));
  fVar7 = 1050.0;
  if (fVar8 <= 1050.0) {
    fVar7 = fVar8;
  }
  fVar9 = (float)(~-(uint)(1050.0 < fVar8) & (uint)fVar9 |
                 (uint)(fVar10 * 1050.0) & -(uint)(1050.0 < fVar8)) * Zoom;
  fVar8 = (((float)iVar3 / 100.0) * CenterX + (float)iVar5) - fVar9 * 0.5;
  fVar10 = (((float)iVar4 / 100.0) * CenterY + (float)iVar6) - fVar7 * Zoom * 0.5;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[5])
            (CONCAT44(in_XMM6_Db,fVar8),fVar10,(ulong)(uint)(fVar9 + fVar8),fVar7 * Zoom + fVar10);
  return;
}

Assistant:

void CRenderTools::MapScreenToGroup(float CenterX, float CenterY, const CMapItemGroup *pGroup, float Zoom)
{
	float aPoints[4];
	MapScreenToWorld(CenterX, CenterY, pGroup->m_ParallaxX/100.0f, pGroup->m_ParallaxY/100.0f,
		pGroup->m_OffsetX, pGroup->m_OffsetY, Graphics()->ScreenAspect(), Zoom, aPoints);
	Graphics()->MapScreen(aPoints[0], aPoints[1], aPoints[2], aPoints[3]);
}